

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::Add
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *propertyRecord,
          PropertyAttributes attributes,bool isInitialized,bool isFixed,bool usedAsFixed,
          ScriptContext *scriptContext)

{
  Type *pTVar1;
  ushort uVar2;
  JavascriptLibrary *pJVar3;
  code *pcVar4;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *pPVar5;
  PropertyRecord *key;
  bool bVar6;
  PropertyId propertyId;
  undefined4 *puVar7;
  int iVar8;
  undefined7 in_register_00000011;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_50;
  DictionaryPropertyDescriptor<unsigned_short> local_48;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  
  propertyRecord_local._4_4_ = (uint)CONCAT71(in_register_00000011,attributes);
  iVar8 = (this->super_DynamicTypeHandler).slotCapacity;
  local_40 = propertyRecord;
  if (0xfffe < iVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17e,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar6) goto LAB_00da3815;
    *puVar7 = 0;
    iVar8 = (this->super_DynamicTypeHandler).slotCapacity;
  }
  uVar2 = this->nextPropertyIndex;
  if (iVar8 <= (int)(uint)uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x17f,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar6) goto LAB_00da3815;
    *puVar7 = 0;
    uVar2 = this->nextPropertyIndex;
  }
  if (uVar2 == 0xffff) {
    ::Math::DefaultOverflowPolicy();
  }
  this->nextPropertyIndex = uVar2 + 1;
  local_48.Attributes = (PropertyAttributes)propertyRecord_local._4_4_;
  local_48.Getter = 0xffff;
  local_48.Setter = 0xffff;
  local_48.Data = uVar2;
  if ((isFixed || usedAsFixed) &&
     (((uint)propertyRecord->pid < 0x10 ||
      ((this->singletonInstance).ptr == (RecyclerWeakReference<Js::DynamicObject> *)0x0)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x184,
                                "((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr))"
                                ,
                                "(!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr)"
                               );
    if (!bVar6) {
LAB_00da3815:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  local_48.flags = (usedAsFixed << 6 | isFixed << 5 | isInitialized << 3) + PreventFalseReference;
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_40,&local_48);
  pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&local_50);
  local_50 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
             &pJVar3->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
  key = local_40;
  pPVar5 = local_50;
  if ((propertyRecord_local._4_4_ & 4) == 0) {
    DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,key);
      ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar5);
    }
  }
  pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&local_50);
  local_50 = &pJVar3->typesWithNoSpecialPropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
  pPVar5 = local_50;
  bVar6 = NoSpecialPropertyCache::IsSpecialProperty(local_40);
  if ((bVar6) &&
     (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(pPVar5);
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::Add(
        const PropertyRecord* propertyRecord,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready
        T index = ::Math::PostInc(nextPropertyIndex);

        DictionaryPropertyDescriptor<T> descriptor(index, attributes);
#if ENABLE_FIXED_FIELDS
        Assert((!isFixed && !usedAsFixed) || (!IsInternalPropertyId(propertyRecord->GetPropertyId()) && this->singletonInstance != nullptr));
        descriptor.SetIsInitialized(isInitialized);
        descriptor.SetIsFixed(isFixed);
        descriptor.SetUsedAsFixed(usedAsFixed);
#endif
        propertyMap->Add(propertyRecord, descriptor);

        scriptContext->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
        scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(this, attributes, propertyRecord, scriptContext);
    }